

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-math.c
# Opt level: O0

PVG_FT_Angle PVG_FT_Angle_Diff(PVG_FT_Angle angle1,PVG_FT_Angle angle2)

{
  undefined8 local_20;
  PVG_FT_Angle delta;
  PVG_FT_Angle angle2_local;
  PVG_FT_Angle angle1_local;
  
  for (local_20 = angle2 - angle1; local_20 < -0xb3ffff; local_20 = local_20 + 0x1680000) {
  }
  for (; 0xb40000 < local_20; local_20 = local_20 + -0x1680000) {
  }
  return local_20;
}

Assistant:

PVG_FT_Angle PVG_FT_Angle_Diff( PVG_FT_Angle  angle1, PVG_FT_Angle  angle2 )
{
    PVG_FT_Angle  delta = angle2 - angle1;

    while ( delta <= -PVG_FT_ANGLE_PI )
        delta += PVG_FT_ANGLE_2PI;

    while ( delta > PVG_FT_ANGLE_PI )
        delta -= PVG_FT_ANGLE_2PI;

    return delta;
}